

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_wav_init_file__internal_FILE
                    (ma_dr_wav *pWav,FILE *pFile,ma_dr_wav_chunk_proc onChunk,void *pChunkUserData,
                    ma_uint32 flags,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  
  mVar1 = ma_dr_wav_preinit(pWav,ma_dr_wav__on_read_stdio,ma_dr_wav__on_seek_stdio,pFile,
                            pAllocationCallbacks);
  if ((mVar1 != 0) &&
     (mVar1 = ma_dr_wav_init__internal(pWav,onChunk,pChunkUserData,flags), mVar1 != 0)) {
    return 1;
  }
  fclose((FILE *)pFile);
  return 0;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_init_file__internal_FILE(ma_dr_wav* pWav, FILE* pFile, ma_dr_wav_chunk_proc onChunk, void* pChunkUserData, ma_uint32 flags, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_bool32 result;
    result = ma_dr_wav_preinit(pWav, ma_dr_wav__on_read_stdio, ma_dr_wav__on_seek_stdio, (void*)pFile, pAllocationCallbacks);
    if (result != MA_TRUE) {
        fclose(pFile);
        return result;
    }
    result = ma_dr_wav_init__internal(pWav, onChunk, pChunkUserData, flags);
    if (result != MA_TRUE) {
        fclose(pFile);
        return result;
    }
    return MA_TRUE;
}